

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_long_long,_signed_char,_5>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long_long *lhs,char *rhs,unsigned_long_long *result)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong *in_RDX;
  char *in_RSI;
  ulong *in_RDI;
  unsigned_long_long tmp;
  
  if (*in_RSI < '\0') {
    uVar1 = *in_RDI;
    uVar2 = *in_RDI;
    uVar3 = AbsValueHelper<signed_char,_0>::Abs('\0');
    *in_RDX = uVar2 + uVar3;
    if (*in_RDX < uVar1) goto LAB_002119fd;
  }
  else {
    if (*in_RDI < (ulong)(long)*in_RSI) {
LAB_002119fd:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - (long)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an std::uint64_t, rhs signed
        // must first see if rhs is positive or negative
        if( rhs >= 0 )
        {
            if( (std::uint64_t)rhs <= lhs )
            {
                result = (T)( lhs - (std::uint64_t)rhs );
                return;
            }
        }
        else
        {
            T tmp = lhs;
            // we're now effectively adding
            result = lhs + AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if(result >= tmp)
                return;
        }

        E::SafeIntOnOverflow();
    }